

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O1

void __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_long>::getBestBFromData
          (FastPForImpl<8U,_unsigned_long> *this,unsigned_long *in,uint8_t *bestb,
          uint8_t *bestcexcept,uint8_t *maxb)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  uint32_t k;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int local_118 [68];
  
  local_118[0x30] = 0;
  local_118[0x31] = 0;
  local_118[0x32] = 0;
  local_118[0x33] = 0;
  local_118[0x34] = 0;
  local_118[0x35] = 0;
  local_118[0x36] = 0;
  local_118[0x37] = 0;
  local_118[0x38] = 0;
  local_118[0x39] = 0;
  local_118[0x3a] = 0;
  local_118[0x3b] = 0;
  local_118[0x3c] = 0;
  local_118[0x3d] = 0;
  local_118[0x3e] = 0;
  local_118[0x3f] = 0;
  local_118[0x20] = 0;
  local_118[0x21] = 0;
  local_118[0x22] = 0;
  local_118[0x23] = 0;
  local_118[0x24] = 0;
  local_118[0x25] = 0;
  local_118[0x26] = 0;
  local_118[0x27] = 0;
  local_118[0x28] = 0;
  local_118[0x29] = 0;
  local_118[0x2a] = 0;
  local_118[0x2b] = 0;
  local_118[0x2c] = 0;
  local_118[0x2d] = 0;
  local_118[0x2e] = 0;
  local_118[0x2f] = 0;
  local_118[0x10] = 0;
  local_118[0x11] = 0;
  local_118[0x12] = 0;
  local_118[0x13] = 0;
  local_118[0x14] = 0;
  local_118[0x15] = 0;
  local_118[0x16] = 0;
  local_118[0x17] = 0;
  local_118[0x18] = 0;
  local_118[0x19] = 0;
  local_118[0x1a] = 0;
  local_118[0x1b] = 0;
  local_118[0x1c] = 0;
  local_118[0x1d] = 0;
  local_118[0x1e] = 0;
  local_118[0x1f] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[8] = 0;
  local_118[9] = 0;
  local_118[10] = 0;
  local_118[0xb] = 0;
  local_118[0xc] = 0;
  local_118[0xd] = 0;
  local_118[0xe] = 0;
  local_118[0xf] = 0;
  local_118[0x40] = 0;
  lVar5 = 0;
  do {
    uVar9 = in[lVar5];
    if (uVar9 == 0) {
      uVar9 = 0;
    }
    else {
      lVar2 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar9 = (ulong)((int)lVar2 + 1);
    }
    local_118[uVar9] = local_118[uVar9] + 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  bVar3 = 0x41;
  do {
    bVar3 = bVar3 - 1;
  } while (local_118[bVar3] == 0);
  *bestb = bVar3;
  *maxb = bVar3;
  bVar3 = *bestb;
  *bestcexcept = '\0';
  bVar1 = *bestb;
  if (bVar1 - 1 < 0x40) {
    uVar7 = (uint)bVar3 << 8;
    iVar8 = (uint)bVar1 * 0x100 + -0xf8;
    iVar10 = 9 - (uint)bVar1;
    iVar11 = 0;
    uVar4 = (uint)bVar1;
    do {
      iVar11 = iVar11 + local_118[uVar4];
      iVar6 = 0;
      if (*maxb == uVar4) {
        iVar6 = iVar11;
      }
      uVar12 = (((uint)*maxb + iVar10) * iVar11 - iVar6) + iVar8;
      if (uVar12 < uVar7) {
        *bestb = (char)uVar4 + 0xff;
        *bestcexcept = (uint8_t)iVar11;
        uVar7 = uVar12;
      }
      iVar8 = iVar8 + -0x100;
      iVar10 = iVar10 + 1;
      uVar12 = uVar4 - 2;
      uVar4 = uVar4 - 1;
    } while (uVar12 < 0x40);
  }
  return;
}

Assistant:

void getBestBFromData(const IntType *in, uint8_t &bestb, uint8_t &bestcexcept,
                        uint8_t &maxb) {
    uint8_t bits = sizeof(IntType) * 8;
    uint32_t freqs[65];
    for (uint32_t k = 0; k <= bits; ++k) freqs[k] = 0;
    for (uint32_t k = 0; k < BlockSize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    bestb = bits;
    while (freqs[bestb] == 0) bestb--;
    maxb = bestb;
    uint32_t bestcost = bestb * BlockSize;
    uint32_t cexcept = 0;
    bestcexcept = static_cast<uint8_t>(cexcept);
    for (uint32_t b = bestb - 1; b < bits; --b) {
      cexcept += freqs[b + 1];
      uint32_t thiscost = cexcept * overheadofeachexcept +
                          cexcept * (maxb - b) + b * BlockSize +
                          8;  // the  extra 8 is the cost of storing maxbits
      if (maxb - b == 1) thiscost -= cexcept;
      if (thiscost < bestcost) {
        bestcost = thiscost;
        bestb = static_cast<uint8_t>(b);
        bestcexcept = static_cast<uint8_t>(cexcept);
      }
    }
  }